

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,std::span<slang::parsing::Token,18446744073709551615ul>>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          ConditionalDirectiveExpressionSyntax *args_2,
          span<slang::parsing::Token,_18446744073709551615UL> *args_3)

{
  pointer pTVar1;
  size_t sVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ConditionalBranchDirectiveSyntax *pCVar8;
  uint uStack_34;
  
  pCVar8 = (ConditionalBranchDirectiveSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalBranchDirectiveSyntax *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (ConditionalBranchDirectiveSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  TVar4 = args_1->kind;
  uVar5 = args_1->field_0x2;
  NVar6.raw = (args_1->numFlags).raw;
  uVar7 = args_1->rawLen;
  pIVar3 = args_1->info;
  pTVar1 = args_3->_M_ptr;
  sVar2 = (args_3->_M_extent)._M_extent_value;
  (pCVar8->super_DirectiveSyntax).super_SyntaxNode.kind = *args;
  (pCVar8->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar8->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar8->super_DirectiveSyntax).directive.kind = TVar4;
  (pCVar8->super_DirectiveSyntax).directive.field_0x2 = uVar5;
  (pCVar8->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->super_DirectiveSyntax).directive.rawLen = uVar7;
  (pCVar8->super_DirectiveSyntax).directive.info = pIVar3;
  (pCVar8->expr).ptr = args_2;
  (pCVar8->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
  *(ulong *)&(pCVar8->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       (ulong)uStack_34;
  *(undefined8 *)((long)&(pCVar8->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent + 4)
       = 0;
  *(undefined4 *)
   ((long)&(pCVar8->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode + 4) = 0;
  (pCVar8->disabledTokens).super_SyntaxListBase.childCount = sVar2;
  (pCVar8->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = pTVar1
  ;
  (pCVar8->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e6248;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pCVar8;
  (pCVar8->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar8;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }